

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_io_thread.cpp
# Opt level: O0

int __thiscall
libtorrent::disk_io_thread::flush_range
          (disk_io_thread *this,cached_piece_entry *pe,int start,int end,jobqueue_t *completed_jobs,
          unique_lock<std::mutex> *l)

{
  uint uVar1;
  difference_type dVar2;
  cached_piece_entry *pcVar3;
  int end_00;
  span<int> *this_00;
  span<char> *first;
  span<libtorrent::span<char>_> *psVar4;
  disk_io_thread *pdVar5;
  int iVar6;
  long l_00;
  span<char> *last;
  long l_01;
  int *p;
  int *last_00;
  int *piVar7;
  block_cache *pbVar8;
  int aiStack_1e0 [2];
  span<int> sStack_1d8;
  int aiStack_1c8 [2];
  long lStack_1c0;
  span<char> sStack_1b8;
  undefined1 local_1a1;
  cached_piece_entry *local_1a0;
  int local_194;
  cached_piece_entry *local_190;
  int local_188;
  int local_184;
  span<int> *local_180;
  int *local_178;
  span<char> *local_170;
  span<libtorrent::span<char>_> *local_168;
  long local_160;
  disk_io_thread *local_158;
  int local_14c;
  undefined1 auStack_148 [4];
  int evict;
  span<const_libtorrent::span<char>_> local_138;
  scoped_unlocker_impl<std::unique_lock<std::mutex>_> local_128;
  scoped_unlocker_impl<std::unique_lock<std::mutex>_> unlocker;
  piece_refcount_holder refcount_holder;
  storage_error error;
  span<int> local_f0;
  span<libtorrent::span<char>_> local_e0;
  int local_cc;
  undefined1 local_c8 [4];
  int iov_len;
  alloca_destructor<int> flushing_destructor;
  int *TORRENT_ALLOCA_tmp_1;
  long TORRENT_ALLOCA_size_1;
  span<int> flushing;
  alloca_destructor<libtorrent::span<char>_> iov_destructor;
  iovec_t *TORRENT_ALLOCA_tmp;
  long TORRENT_ALLOCA_size;
  span<libtorrent::span<char>_> iov;
  unique_lock<std::mutex> *l_local;
  jobqueue_t *completed_jobs_local;
  int end_local;
  int start_local;
  cached_piece_entry *pe_local;
  disk_io_thread *this_local;
  
  local_168 = (span<libtorrent::span<char>_> *)&TORRENT_ALLOCA_size;
  lStack_1c0 = 0x63347a;
  local_158 = this;
  iov.m_len = (difference_type)l;
  span<libtorrent::span<char>_>::span(local_168);
  lStack_1c0 = 0x633490;
  l_00 = libtorrent::aux::numeric_cast<long,unsigned_long,void>
                   ((ulong)(*(uint *)&pe->field_0x80 & 0x3fff));
  (&lStack_1c0)[l_00 * -2] = 0x6334ba;
  span<libtorrent::span<char>_>::span
            ((span<libtorrent::span<char>_> *)&iov_destructor.objects.m_len,&sStack_1b8 + -l_00,l_00
            );
  psVar4 = local_168;
  TORRENT_ALLOCA_size = iov_destructor.objects.m_len;
  (&lStack_1c0)[l_00 * -2] = 0x6334ce;
  local_170 = span<libtorrent::span<char>_>::begin(psVar4);
  psVar4 = local_168;
  (&lStack_1c0)[l_00 * -2] = 0x6334e1;
  last = span<libtorrent::span<char>_>::end(psVar4);
  first = local_170;
  (&lStack_1c0)[l_00 * -2] = 0x6334f0;
  libtorrent::aux::uninitialized_default_construct<libtorrent::span<char>*>(first,last);
  psVar4 = local_168;
  (&lStack_1c0)[l_00 * -2] = 0x633500;
  span<libtorrent::span<char>>::
  span<libtorrent::span<libtorrent::span<char>>,libtorrent::span<char>,void>
            ((span<libtorrent::span<char>> *)&flushing.m_len,psVar4);
  (&lStack_1c0)[l_00 * -2] = 0x633509;
  span<int>::span((span<int> *)&TORRENT_ALLOCA_size_1);
  uVar1 = *(uint *)&pe->field_0x80;
  (&lStack_1c0)[l_00 * -2] = 0x63351f;
  l_01 = libtorrent::aux::numeric_cast<long,unsigned_long,void>((ulong)(uVar1 & 0x3fff));
  p = (int *)((long)(&sStack_1b8 + -l_00) - (l_01 * 4 + 0xfU & 0xfffffffffffffff0));
  local_160 = l_01;
  p[-2] = 0x633573;
  p[-1] = 0;
  span<int>::span((span<int> *)&flushing_destructor.objects.m_len,p,l_01);
  TORRENT_ALLOCA_size_1 = flushing_destructor.objects.m_len;
  local_180 = (span<int> *)&TORRENT_ALLOCA_size_1;
  p[-2] = 0x63358e;
  p[-1] = 0;
  local_178 = span<int>::begin((span<int> *)&TORRENT_ALLOCA_size_1);
  this_00 = local_180;
  p[-2] = 0x6335a1;
  p[-1] = 0;
  last_00 = span<int>::end(this_00);
  piVar7 = local_178;
  p[-2] = 0x6335b0;
  p[-1] = 0;
  libtorrent::aux::uninitialized_default_construct<int*>(piVar7,last_00);
  p[-2] = 0x6335c2;
  p[-1] = 0;
  span<int>::span<libtorrent::span<int>,int,void>
            ((span<int> *)local_c8,(span<int> *)&TORRENT_ALLOCA_size_1);
  local_190 = pe;
  local_188 = start;
  local_184 = end;
  p[-2] = 0x6335f1;
  p[-1] = 0;
  span<libtorrent::span<char>>::
  span<libtorrent::span<libtorrent::span<char>>,libtorrent::span<char>,void>
            ((span<libtorrent::span<char>> *)&local_e0,
             (span<libtorrent::span<char>_> *)&TORRENT_ALLOCA_size);
  p[-2] = 0x633603;
  p[-1] = 0;
  span<int>::span<libtorrent::span<int>,int,void>(&local_f0,(span<int> *)&TORRENT_ALLOCA_size_1);
  pdVar5 = local_158;
  end_00 = local_184;
  iVar6 = local_188;
  pcVar3 = local_190;
  *(int **)(p + -8) = local_f0.m_ptr;
  *(difference_type *)(p + -6) = local_f0.m_len;
  p[-4] = 0;
  p[-10] = 0x63364a;
  p[-9] = 0;
  local_194 = build_iovec(pdVar5,pcVar3,iVar6,end_00,local_e0,*(span<int> *)(p + -8),p[-4]);
  local_cc = local_194;
  if (local_194 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    p[-2] = 0x6336c1;
    p[-1] = 0;
    storage_error::storage_error((storage_error *)&refcount_holder.m_executed);
    p[-2] = 0x6336d3;
    p[-1] = 0;
    anon_unknown_0::piece_refcount_holder::piece_refcount_holder
              ((piece_refcount_holder *)&unlocker,pe);
    dVar2 = iov.m_len;
    p[-2] = 0x6336e5;
    p[-1] = 0;
    (anonymous_namespace)::scoped_unlock<std::unique_lock<std::mutex>>
              ((_anonymous_namespace_ *)&local_128,(unique_lock<std::mutex> *)dVar2);
    local_1a0 = pe;
    p[-2] = 0x633702;
    p[-1] = 0;
    span<libtorrent::span<char>const>::
    span<libtorrent::span<libtorrent::span<char>>,libtorrent::span<char>,void>
              ((span<libtorrent::span<char>const> *)&local_138,
               (span<libtorrent::span<char>_> *)&TORRENT_ALLOCA_size);
    p[-2] = 0x633714;
    p[-1] = 0;
    span<int_const>::span<libtorrent::span<int>,int,void>
              ((span<int_const> *)auStack_148,(span<int> *)&TORRENT_ALLOCA_size_1);
    iVar6 = local_cc;
    pdVar5 = local_158;
    pcVar3 = local_1a0;
    *(bool **)(p + -2) = &refcount_holder.m_executed;
    p[-4] = iVar6;
    p[-6] = 0x633761;
    p[-5] = 0;
    flush_iovec(pdVar5,pcVar3,local_138,_auStack_148,p[-4],*(storage_error **)(p + -2));
    p[-2] = 0x633773;
    p[-1] = 0;
    anon_unknown_0::scoped_unlocker_impl<std::unique_lock<std::mutex>_>::~scoped_unlocker_impl
              (&local_128);
    p[-2] = 0x63377f;
    p[-1] = 0;
    anon_unknown_0::piece_refcount_holder::~piece_refcount_holder
              ((piece_refcount_holder *)&unlocker);
    sStack_1b8.m_len = (difference_type)pe;
    p[-2] = 0x633793;
    p[-1] = 0;
    piVar7 = span<int>::data((span<int> *)&TORRENT_ALLOCA_size_1);
    iVar6 = local_cc;
    pdVar5 = local_158;
    dVar2 = sStack_1b8.m_len;
    *(jobqueue_t **)(p + -4) = completed_jobs;
    p[-6] = 0x6337c7;
    p[-5] = 0;
    local_1a1 = iovec_flushed(pdVar5,(cached_piece_entry *)dVar2,piVar7,iVar6,0,
                              (storage_error *)&refcount_holder.m_executed,*(jobqueue_t **)(p + -4))
    ;
    if (!(bool)local_1a1) {
      pbVar8 = &local_158->m_disk_cache;
      p[-2] = 0x6337f6;
      p[-1] = 0;
      block_cache::maybe_free_piece(pbVar8,pe);
    }
    pbVar8 = &local_158->m_disk_cache;
    p[-2] = 0x633852;
    p[-1] = 0;
    iVar6 = disk_buffer_pool::num_to_evict(&pbVar8->super_disk_buffer_pool,0);
    sStack_1b8.m_ptr._4_4_ = iVar6;
    local_14c = iVar6;
    if (0 < iVar6) {
      pbVar8 = &local_158->m_disk_cache;
      p[-2] = 0x63388c;
      p[-1] = 0;
      block_cache::try_evict_blocks(pbVar8,iVar6,(cached_piece_entry *)0x0);
    }
    this_local._4_4_ = local_cc;
  }
  p[-2] = 0x6338af;
  p[-1] = 0;
  libtorrent::aux::alloca_destructor<int>::~alloca_destructor((alloca_destructor<int> *)local_c8);
  p[-2] = 0x6338b8;
  p[-1] = 0;
  libtorrent::aux::alloca_destructor<libtorrent::span<char>_>::~alloca_destructor
            ((alloca_destructor<libtorrent::span<char>_> *)&flushing.m_len);
  return this_local._4_4_;
}

Assistant:

int disk_io_thread::flush_range(cached_piece_entry* pe, int const start, int const end
		, jobqueue_t& completed_jobs, std::unique_lock<std::mutex>& l)
	{
		TORRENT_ASSERT(l.owns_lock());

		DLOG("flush_range: piece=%d [%d, %d)\n"
			, static_cast<int>(pe->piece), start, end);
		TORRENT_PIECE_ASSERT(start >= 0, pe);
		TORRENT_PIECE_ASSERT(start < end, pe);

		TORRENT_ALLOCA(iov, iovec_t, pe->blocks_in_piece);
		TORRENT_ALLOCA(flushing, int, pe->blocks_in_piece);
		int const iov_len = build_iovec(pe, start, end, iov, flushing, 0);
		if (iov_len == 0) return 0;

		TORRENT_PIECE_ASSERT(pe->cache_state <= cached_piece_entry::read_lru1 || pe->cache_state == cached_piece_entry::read_lru2, pe);
#if TORRENT_USE_ASSERTS
		pe->piece_log.push_back(piece_log_t(piece_log_t::flush_range, -1));
#endif

		storage_error error;
		{
			piece_refcount_holder refcount_holder(pe);
			auto unlocker = scoped_unlock(l);

			flush_iovec(pe, iov, flushing, iov_len, error);
		}

		if (!iovec_flushed(pe, flushing.data(), iov_len, 0, error, completed_jobs))
			m_disk_cache.maybe_free_piece(pe);

		// if the cache is under high pressure, we need to evict
		// the blocks we just flushed to make room for more write pieces
		int const evict = m_disk_cache.num_to_evict(0);
		if (evict > 0) m_disk_cache.try_evict_blocks(evict);

		return iov_len;
	}